

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

void __thiscall
SslTcpSocketImpl::SslTcpSocketImpl
          (SslTcpSocketImpl *this,BaseSocket *pBkref,TcpSocketImpl *pTcpSocket)

{
  _Any_data __tmp;
  _Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_unsigned_char_*,_unsigned_long,_bool_&)>
  local_68;
  _Invoker_type p_Stack_50;
  SslTcpSocketImpl *local_48;
  undefined8 uStack_40;
  
  TcpSocketImpl::TcpSocketImpl(&this->super_TcpSocketImpl,pBkref,pTcpSocket);
  (this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslTcpSocketImpl_00144df0;
  OpenSSLWrapper::SslClientContext::SslClientContext(&this->m_pClientCtx);
  this->m_bCloseReq = false;
  (this->m_fClientConnectedParam).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fClientConnectedParam)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fClientConnectedParam).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fClientConnectedParam).super__Function_base._M_functor + 8) = 0;
  (this->m_fClientConnected).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fClientConnected)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fClientConnected).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fClientConnected).super__Function_base._M_functor + 8) = 0;
  (this->m_pServerCtx).
  super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pSslCon)._M_t.
  super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ._M_t.
  super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl = (SslConnection *)0x0
  ;
  (this->m_pServerCtx).
  super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pServerCtx).
  super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)&this->m_iSslInit = 0;
  *(undefined8 *)
   ((long)&(this->m_vProtoList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->m_vProtoList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vProtoList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_strTrustRootCert)._M_dataplus._M_p = (pointer)&(this->m_strTrustRootCert).field_2;
  (this->m_strTrustRootCert)._M_string_length = 0;
  (this->m_strTrustRootCert).field_2._M_local_buf[0] = '\0';
  (this->m_mxEnDecode).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mxEnDecode).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mxEnDecode).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mxEnDecode).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mxEnDecode).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  uStack_40 = 0;
  local_68._M_f =
       *(offset_in_SslTcpSocketImpl_to_subr *)
        &(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_functor;
  local_68._8_8_ =
       *(undefined8 *)
        ((long)&(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_functor + 8);
  *(SslTcpSocketImpl **)&(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_functor
       = this;
  *(undefined8 *)
   ((long)&(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_functor + 8) = 0;
  local_68._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_manager;
  p_Stack_50 = (this->super_TcpSocketImpl).m_fnSslInitDone._M_invoker;
  (this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_manager =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/SslSocket.cpp:59:23)>
       ::_M_manager;
  (this->super_TcpSocketImpl).m_fnSslInitDone._M_invoker =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/SslSocket.cpp:59:23)>
       ::_M_invoke;
  local_48 = this;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_68._M_f = (offset_in_SslTcpSocketImpl_to_subr)DatenEncode;
  local_68._8_8_ = 0;
  local_68._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  std::function<int(unsigned_char_const*,unsigned_long)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long)> *)
             &(this->super_TcpSocketImpl).m_fnSslEncode,
             (_Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_unsigned_char_*,_unsigned_long)>
              *)&local_68);
  local_68._M_f = (offset_in_SslTcpSocketImpl_to_subr)DatenDecode;
  local_68._8_8_ = 0;
  local_68._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)
             &(this->super_TcpSocketImpl).m_fnSslDecode,&local_68);
  std::function<void_(TcpSocket_*)>::swap
            (&this->m_fClientConnected,&(this->super_TcpSocketImpl).m_fClientConnected);
  std::function<void_(TcpSocket_*,_void_*)>::swap
            (&this->m_fClientConnectedParam,&(this->super_TcpSocketImpl).m_fClientConnectedParam);
  return;
}

Assistant:

SslTcpSocketImpl::SslTcpSocketImpl(BaseSocket* pBkref, TcpSocketImpl* pTcpSocket) : TcpSocketImpl(pBkref, pTcpSocket), m_bCloseReq(false), m_iSslInit(0)
{   // Switch from Tcp to Ssl/Tls
    m_fnSslInitDone = [this]() noexcept -> int { return m_iSslInit; };
    m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, this, _1, _2);
    m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, this, _1, _2, _3);

    m_fClientConnected.swap(TcpSocketImpl::m_fClientConnected);
    m_fClientConnectedParam.swap(TcpSocketImpl::m_fClientConnectedParam);
}